

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastMtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint *puVar4;
  MessageLite **ppMVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  ushort *puVar10;
  int v1;
  Arena *arena;
  ushort *local_48 [2];
  undefined4 local_34;
  
  if (data.field_0._0_2_ != 0) {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar4 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar4 = *puVar4 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  ppMVar5 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)data.field_0 >> 0x30);
  lVar1 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*ppMVar5 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar6 = ClassData::New(*(ClassData **)(lVar1 + 0x20),arena);
    *ppMVar5 = pMVar6;
  }
  local_48[0] = (ushort *)(ptr + 2);
  ReadSize((char **)local_48);
  if ((local_48[0] != (ushort *)0x0) && (0 < ctx->depth_)) {
    EpsCopyInputStream::PushLimit
              ((EpsCopyInputStream *)&stack0xffffffffffffffcc,(char *)ctx,(int)local_48[0]);
    v1 = ctx->depth_ + -1;
    ctx->depth_ = v1;
    if (local_48[0] != (ushort *)0x0) {
      pMVar6 = *ppMVar5;
      while (bVar2 = ParseContext::Done(ctx,(char **)local_48), !bVar2) {
        uVar3 = (uint)*(byte *)(lVar1 + 8) & (uint)*local_48[0];
        if ((uVar3 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        uVar7 = (ulong)(uVar3 & 0xfffffff8);
        local_48[0] = (ushort *)
                      (**(code **)(lVar1 + 0x38 + uVar7 * 2))
                                (pMVar6,local_48[0],ctx,
                                 (ulong)*local_48[0] ^ *(ulong *)(lVar1 + 0x40 + uVar7 * 2),lVar1,0)
        ;
        if ((local_48[0] == (ushort *)0x0) ||
           ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
      }
      puVar10 = local_48[0];
      if ((*(byte *)(lVar1 + 9) & 1) != 0) {
        puVar10 = (ushort *)(**(code **)(lVar1 + 0x28))(pMVar6,local_48[0],ctx);
      }
      if ((puVar10 != (ushort *)0x0) &&
         (psVar8 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                             (v1,ctx->depth_,"old_depth == depth_"), psVar8 != (string *)0x0)) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,1099,psVar8->_M_string_length,(psVar8->_M_dataplus)._M_p);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_48);
      }
      ctx->depth_ = ctx->depth_ + 1;
      local_48[0] = (ushort *)CONCAT44(local_48[0]._4_4_,local_34);
      bVar2 = EpsCopyInputStream::PopLimit(&ctx->super_EpsCopyInputStream,(LimitToken *)local_48);
      if (!bVar2) {
        return (char *)0x0;
      }
      return (char *)puVar10;
    }
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}